

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_math.c
# Opt level: O1

REF_STATUS ref_math_orthonormal_system(REF_DBL *orth0,REF_DBL *orth1,REF_DBL *orth2)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  
  uVar1 = ref_math_normalize(orth0);
  if (uVar1 == 0) {
    dVar3 = *orth0;
    dVar2 = orth0[1];
    if (dVar3 <= -dVar3) {
      dVar3 = -dVar3;
    }
    if (dVar2 <= -dVar2) {
      dVar2 = -dVar2;
    }
    if (dVar2 <= dVar3) {
      dVar2 = orth0[2];
      if (dVar2 <= -dVar2) {
        dVar2 = -dVar2;
      }
      if (dVar2 <= dVar3) {
        *orth1 = 0.0;
        orth1[1] = 1.0;
        orth1[2] = 0.0;
      }
    }
    dVar3 = *orth0;
    dVar2 = orth0[1];
    if (dVar2 <= -dVar2) {
      dVar2 = -dVar2;
    }
    if (dVar3 <= -dVar3) {
      dVar3 = -dVar3;
    }
    if (dVar3 <= dVar2) {
      dVar3 = orth0[2];
      if (dVar3 <= -dVar3) {
        dVar3 = -dVar3;
      }
      if (dVar3 <= dVar2) {
        *orth1 = 0.0;
        orth1[1] = 0.0;
        orth1[2] = 1.0;
      }
    }
    dVar3 = *orth0;
    dVar2 = orth0[2];
    if (dVar2 <= -dVar2) {
      dVar2 = -dVar2;
    }
    if (dVar3 <= -dVar3) {
      dVar3 = -dVar3;
    }
    if (dVar3 <= dVar2) {
      dVar3 = orth0[1];
      if (dVar3 <= -dVar3) {
        dVar3 = -dVar3;
      }
      if (dVar3 <= dVar2) {
        *orth1 = 1.0;
        orth1[1] = 0.0;
        orth1[2] = 0.0;
      }
    }
    dVar3 = orth0[2] * orth1[2] + *orth0 * *orth1 + orth0[1] * orth1[1];
    *orth1 = *orth1 - *orth0 * dVar3;
    orth1[1] = orth1[1] - orth0[1] * dVar3;
    orth1[2] = orth1[2] - dVar3 * orth0[2];
    uVar1 = ref_math_normalize(orth1);
    if (uVar1 == 0) {
      *orth2 = orth0[1] * orth1[2] - orth1[1] * orth0[2];
      orth2[1] = orth0[2] * *orth1 - orth1[2] * *orth0;
      orth2[2] = *orth0 * orth1[1] - *orth1 * orth0[1];
      uVar1 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",0x45,
             "ref_math_orthonormal_system",(ulong)uVar1,"orthonormalize orth1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",0x31,
           "ref_math_orthonormal_system",(ulong)uVar1,"orthonormalize input orth0");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_math_orthonormal_system(REF_DBL *orth0, REF_DBL *orth1,
                                               REF_DBL *orth2) {
  REF_DBL dot;
  RSS(ref_math_normalize(orth0), "orthonormalize input orth0");
  if (ABS(orth0[0]) >= ABS(orth0[1]) && ABS(orth0[0]) >= ABS(orth0[2])) {
    orth1[0] = 0.0;
    orth1[1] = 1.0;
    orth1[2] = 0.0;
  }
  if (ABS(orth0[1]) >= ABS(orth0[0]) && ABS(orth0[1]) >= ABS(orth0[2])) {
    orth1[0] = 0.0;
    orth1[1] = 0.0;
    orth1[2] = 1.0;
  }
  if (ABS(orth0[2]) >= ABS(orth0[0]) && ABS(orth0[2]) >= ABS(orth0[1])) {
    orth1[0] = 1.0;
    orth1[1] = 0.0;
    orth1[2] = 0.0;
  }
  dot = ref_math_dot(orth0, orth1);
  orth1[0] -= dot * orth0[0];
  orth1[1] -= dot * orth0[1];
  orth1[2] -= dot * orth0[2];
  RSS(ref_math_normalize(orth1), "orthonormalize orth1");
  ref_math_cross_product(orth0, orth1, orth2);
  return REF_SUCCESS;
}